

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlElementContentPtr
xmlParseElementChildrenContentDeclPriv(xmlParserCtxtPtr ctxt,int inputchk,int depth)

{
  xmlChar xVar1;
  xmlElementContentType xVar2;
  _xmlElementContent *p_Var3;
  byte bVar4;
  _xmlElementContent *p_Var5;
  xmlElementContentPtr cur;
  xmlChar *pxVar6;
  xmlParserInputPtr pxVar7;
  byte bVar8;
  int iVar9;
  long lVar10;
  byte bVar11;
  xmlElementContentPtr pxVar12;
  xmlElementContentPtr cur_00;
  bool bVar13;
  undefined8 in_stack_ffffffffffffffb8;
  
  iVar9 = 0x800;
  if ((ctxt->options & 0x80000) == 0) {
    iVar9 = 0x100;
  }
  if (iVar9 < depth) {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_RESOURCE_LIMIT,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,depth,
               "xmlParseElementChildrenContentDecl : depth %d too deep, use XML_PARSE_HUGE\n",
               CONCAT44((int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),depth));
    return (xmlElementContentPtr)0x0;
  }
  xmlSkipBlankCharsPE(ctxt);
  pxVar7 = ctxt->input;
  if (((pxVar7->flags & 0x40) == 0) && ((long)pxVar7->end - (long)pxVar7->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    pxVar7 = ctxt->input;
  }
  if (*pxVar7->cur == '(') {
    iVar9 = pxVar7->id;
    xmlNextChar(ctxt);
    xmlSkipBlankCharsPE(ctxt);
    p_Var5 = xmlParseElementChildrenContentDeclPriv(ctxt,iVar9,depth + 1);
    if (p_Var5 == (xmlElementContentPtr)0x0) {
      return (xmlElementContentPtr)0x0;
    }
    xmlSkipBlankCharsPE(ctxt);
    pxVar7 = ctxt->input;
    if ((pxVar7->flags & 0x40) != 0) goto LAB_00139cb9;
    lVar10 = (long)pxVar7->end - (long)pxVar7->cur;
  }
  else {
    pxVar6 = xmlParseName(ctxt);
    if (pxVar6 == (xmlChar *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_STARTED,(char *)0x0);
      return (xmlElementContentPtr)0x0;
    }
    p_Var5 = xmlNewDocElementContent(ctxt->myDoc,pxVar6,XML_ELEMENT_CONTENT_ELEMENT);
    if (p_Var5 == (xmlElementContentPtr)0x0) {
      xmlCtxtErrMemory(ctxt);
      return (xmlElementContentPtr)0x0;
    }
    pxVar7 = ctxt->input;
    if (((pxVar7->flags & 0x40) == 0) && ((long)pxVar7->end - (long)pxVar7->cur < 0xfa)) {
      xmlParserGrow(ctxt);
      pxVar7 = ctxt->input;
    }
    xVar1 = *pxVar7->cur;
    if (xVar1 == '*') {
      p_Var5->ocur = XML_ELEMENT_CONTENT_MULT;
LAB_00139c80:
      xmlNextChar(ctxt);
    }
    else {
      if (xVar1 == '+') {
        p_Var5->ocur = XML_ELEMENT_CONTENT_PLUS;
        goto LAB_00139c80;
      }
      if (xVar1 == '?') {
        p_Var5->ocur = XML_ELEMENT_CONTENT_OPT;
        goto LAB_00139c80;
      }
      p_Var5->ocur = XML_ELEMENT_CONTENT_ONCE;
    }
    pxVar7 = ctxt->input;
    if ((pxVar7->flags & 0x40) != 0) goto LAB_00139cb9;
    lVar10 = (long)pxVar7->end - (long)pxVar7->cur;
  }
  if (lVar10 < 0xfa) {
    xmlParserGrow(ctxt);
  }
LAB_00139cb9:
  xmlSkipBlankCharsPE(ctxt);
  pxVar7 = ctxt->input;
  cur_00 = p_Var5;
  if (*pxVar7->cur != 0x29) {
    if (ctxt->disableSAX < 2) {
      cur = (xmlElementContentPtr)0x0;
      pxVar12 = p_Var5;
      bVar4 = *pxVar7->cur;
      bVar8 = 0;
      do {
        bVar11 = bVar4;
        if (bVar11 != 0x7c) {
          if (bVar11 == 0x2c) {
            if ((bVar8 == 0) || (bVar8 == 0x2c)) {
              xmlNextChar(ctxt);
              p_Var5 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_SEQ);
              if (p_Var5 == (xmlElementContentPtr)0x0) {
                xmlCtxtErrMemory(ctxt);
                if ((cur != (xmlElementContentPtr)0x0) && (cur != cur_00)) {
                  xmlFreeDocElementContent(ctxt->myDoc,cur);
                }
                goto LAB_0013a13a;
              }
              goto LAB_00139d6b;
            }
            goto LAB_0013a098;
          }
          xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_FINISHED,(char *)0x0);
LAB_0013a0fc:
          if ((cur != (xmlElementContentPtr)0x0) && (cur != cur_00)) {
            xmlFreeDocElementContent(ctxt->myDoc,cur);
          }
LAB_0013a135:
          if (cur_00 == (xmlElementContentPtr)0x0) {
            return (xmlElementContentPtr)0x0;
          }
LAB_0013a13a:
          xmlFreeDocElementContent(ctxt->myDoc,cur_00);
          return (xmlElementContentPtr)0x0;
        }
        if ((bVar8 != 0) && (bVar8 != 0x7c)) {
LAB_0013a098:
          xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SEPARATOR_REQUIRED,XML_ERR_FATAL,
                     (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,(uint)bVar8,
                     "xmlParseElementChildrenContentDecl : \'%c\' expected\n",
                     CONCAT44((int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(uint)bVar8));
          goto LAB_0013a0fc;
        }
        xmlNextChar(ctxt);
        p_Var5 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_OR);
        if (p_Var5 == (xmlElementContentPtr)0x0) {
          xmlCtxtErrMemory(ctxt);
          goto LAB_0013a0fc;
        }
LAB_00139d6b:
        if (cur == (xmlElementContentPtr)0x0) {
          p_Var5->c1 = cur_00;
          bVar13 = cur_00 != (xmlElementContentPtr)0x0;
          cur = cur_00;
          cur_00 = p_Var5;
          if (bVar13) goto LAB_00139d90;
        }
        else {
          pxVar12->c2 = p_Var5;
          p_Var5->parent = pxVar12;
          p_Var5->c1 = cur;
LAB_00139d90:
          cur->parent = p_Var5;
        }
        pxVar7 = ctxt->input;
        if (((pxVar7->flags & 0x40) == 0) && ((long)pxVar7->end - (long)pxVar7->cur < 0xfa)) {
          xmlParserGrow(ctxt);
        }
        xmlSkipBlankCharsPE(ctxt);
        pxVar7 = ctxt->input;
        if (((pxVar7->flags & 0x40) == 0) && ((long)pxVar7->end - (long)pxVar7->cur < 0xfa)) {
          xmlParserGrow(ctxt);
          pxVar7 = ctxt->input;
        }
        if (*pxVar7->cur == '(') {
          iVar9 = pxVar7->id;
          xmlNextChar(ctxt);
          xmlSkipBlankCharsPE(ctxt);
          cur = xmlParseElementChildrenContentDeclPriv(ctxt,iVar9,depth + 1);
          if (cur != (xmlElementContentPtr)0x0) {
            xmlSkipBlankCharsPE(ctxt);
            goto LAB_00139ea5;
          }
          goto LAB_0013a135;
        }
        pxVar6 = xmlParseName(ctxt);
        if (pxVar6 == (xmlChar *)0x0) {
          xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_STARTED,(char *)0x0);
          if (cur_00 == (xmlElementContentPtr)0x0) {
            return (xmlElementContentPtr)0x0;
          }
          goto LAB_0013a13a;
        }
        cur = xmlNewDocElementContent(ctxt->myDoc,pxVar6,XML_ELEMENT_CONTENT_ELEMENT);
        if (cur == (xmlElementContentPtr)0x0) {
          xmlCtxtErrMemory(ctxt);
          goto LAB_0013a135;
        }
        xVar1 = *ctxt->input->cur;
        if (xVar1 == '*') {
          cur->ocur = XML_ELEMENT_CONTENT_MULT;
        }
        else if (xVar1 == '+') {
          cur->ocur = XML_ELEMENT_CONTENT_PLUS;
        }
        else {
          if (xVar1 != '?') {
            cur->ocur = XML_ELEMENT_CONTENT_ONCE;
            goto LAB_00139ea5;
          }
          cur->ocur = XML_ELEMENT_CONTENT_OPT;
        }
        xmlNextChar(ctxt);
LAB_00139ea5:
        xmlSkipBlankCharsPE(ctxt);
        pxVar7 = ctxt->input;
        if (((pxVar7->flags & 0x40) == 0) && ((long)pxVar7->end - (long)pxVar7->cur < 0xfa)) {
          xmlParserGrow(ctxt);
          pxVar7 = ctxt->input;
        }
        if (*pxVar7->cur == 0x29) goto LAB_00139f00;
        pxVar12 = p_Var5;
        bVar4 = *pxVar7->cur;
        bVar8 = bVar11;
      } while (ctxt->disableSAX < 2);
    }
    else {
      cur = (_xmlElementContent *)0x0;
    }
    if (cur != (_xmlElementContent *)0x0) {
LAB_00139f00:
      p_Var5->c2 = cur;
      cur->parent = p_Var5;
    }
  }
  if (pxVar7->id != inputchk) {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ENTITY_BOUNDARY,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
               "Element content declaration doesn\'t start and stop in the same entity\n");
  }
  xmlNextChar(ctxt);
  xVar1 = *ctxt->input->cur;
  if (xVar1 == '*') {
    if (cur_00 != (xmlElementContentPtr)0x0) {
      cur_00->ocur = XML_ELEMENT_CONTENT_MULT;
      xVar2 = cur_00->type;
      p_Var5 = cur_00;
      while (xVar2 == XML_ELEMENT_CONTENT_OR) {
        p_Var3 = p_Var5->c1;
        if ((p_Var3 != (_xmlElementContent *)0x0) &&
           ((p_Var3->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT)) {
          p_Var3->ocur = XML_ELEMENT_CONTENT_ONCE;
        }
        p_Var5 = p_Var5->c2;
        if (p_Var5 == (_xmlElementContent *)0x0) break;
        if ((p_Var5->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT) {
          p_Var5->ocur = XML_ELEMENT_CONTENT_ONCE;
        }
        xVar2 = p_Var5->type;
      }
    }
  }
  else if (xVar1 == '+') {
    if ((cur_00 != (xmlElementContentPtr)0x0) &&
       (cur_00->ocur = ((cur_00->ocur & ~XML_ELEMENT_CONTENT_ONCE) != XML_ELEMENT_CONTENT_OPT) +
                       XML_ELEMENT_CONTENT_MULT, p_Var5->type == XML_ELEMENT_CONTENT_OR)) {
      bVar13 = false;
      do {
        p_Var3 = p_Var5->c1;
        if ((p_Var3 != (_xmlElementContent *)0x0) &&
           ((p_Var3->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT)) {
          p_Var3->ocur = XML_ELEMENT_CONTENT_ONCE;
          bVar13 = true;
        }
        p_Var5 = p_Var5->c2;
        if (p_Var5 == (_xmlElementContent *)0x0) break;
        if ((p_Var5->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT) {
          p_Var5->ocur = XML_ELEMENT_CONTENT_ONCE;
          bVar13 = true;
        }
      } while (p_Var5->type == XML_ELEMENT_CONTENT_OR);
      if (bVar13) {
        cur_00->ocur = XML_ELEMENT_CONTENT_MULT;
      }
    }
  }
  else {
    if (xVar1 != '?') {
      return cur_00;
    }
    if (cur_00 != (xmlElementContentPtr)0x0) {
      cur_00->ocur = (cur_00->ocur - XML_ELEMENT_CONTENT_MULT < 2) + XML_ELEMENT_CONTENT_OPT;
    }
  }
  xmlNextChar(ctxt);
  return cur_00;
}

Assistant:

static xmlElementContentPtr
xmlParseElementChildrenContentDeclPriv(xmlParserCtxtPtr ctxt, int inputchk,
                                       int depth) {
    int maxDepth = (ctxt->options & XML_PARSE_HUGE) ? 2048 : 256;
    xmlElementContentPtr ret = NULL, cur = NULL, last = NULL, op = NULL;
    const xmlChar *elem;
    xmlChar type = 0;

    if (depth > maxDepth) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_RESOURCE_LIMIT,
                "xmlParseElementChildrenContentDecl : depth %d too deep, "
                "use XML_PARSE_HUGE\n", depth);
	return(NULL);
    }
    SKIP_BLANKS_PE;
    GROW;
    if (RAW == '(') {
	int inputid = ctxt->input->id;

        /* Recurse on first child */
	NEXT;
	SKIP_BLANKS_PE;
        cur = ret = xmlParseElementChildrenContentDeclPriv(ctxt, inputid,
                                                           depth + 1);
        if (cur == NULL)
            return(NULL);
	SKIP_BLANKS_PE;
	GROW;
    } else {
	elem = xmlParseName(ctxt);
	if (elem == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED, NULL);
	    return(NULL);
	}
        cur = ret = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
	if (cur == NULL) {
	    xmlErrMemory(ctxt);
	    return(NULL);
	}
	GROW;
	if (RAW == '?') {
	    cur->ocur = XML_ELEMENT_CONTENT_OPT;
	    NEXT;
	} else if (RAW == '*') {
	    cur->ocur = XML_ELEMENT_CONTENT_MULT;
	    NEXT;
	} else if (RAW == '+') {
	    cur->ocur = XML_ELEMENT_CONTENT_PLUS;
	    NEXT;
	} else {
	    cur->ocur = XML_ELEMENT_CONTENT_ONCE;
	}
	GROW;
    }
    SKIP_BLANKS_PE;
    while ((RAW != ')') && (PARSER_STOPPED(ctxt) == 0)) {
        /*
	 * Each loop we parse one separator and one element.
	 */
        if (RAW == ',') {
	    if (type == 0) type = CUR;

	    /*
	     * Detect "Name | Name , Name" error
	     */
	    else if (type != CUR) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_SEPARATOR_REQUIRED,
		    "xmlParseElementChildrenContentDecl : '%c' expected\n",
		                  type);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    NEXT;

	    op = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_SEQ);
	    if (op == NULL) {
                xmlErrMemory(ctxt);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
	        xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    if (last == NULL) {
		op->c1 = ret;
		if (ret != NULL)
		    ret->parent = op;
		ret = cur = op;
	    } else {
	        cur->c2 = op;
		if (op != NULL)
		    op->parent = cur;
		op->c1 = last;
		if (last != NULL)
		    last->parent = op;
		cur =op;
		last = NULL;
	    }
	} else if (RAW == '|') {
	    if (type == 0) type = CUR;

	    /*
	     * Detect "Name , Name | Name" error
	     */
	    else if (type != CUR) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_SEPARATOR_REQUIRED,
		    "xmlParseElementChildrenContentDecl : '%c' expected\n",
				  type);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    NEXT;

	    op = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_OR);
	    if (op == NULL) {
                xmlErrMemory(ctxt);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    if (last == NULL) {
		op->c1 = ret;
		if (ret != NULL)
		    ret->parent = op;
		ret = cur = op;
	    } else {
	        cur->c2 = op;
		if (op != NULL)
		    op->parent = cur;
		op->c1 = last;
		if (last != NULL)
		    last->parent = op;
		cur =op;
		last = NULL;
	    }
	} else {
	    xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_FINISHED, NULL);
	    if ((last != NULL) && (last != ret))
	        xmlFreeDocElementContent(ctxt->myDoc, last);
	    if (ret != NULL)
		xmlFreeDocElementContent(ctxt->myDoc, ret);
	    return(NULL);
	}
	GROW;
	SKIP_BLANKS_PE;
	GROW;
	if (RAW == '(') {
	    int inputid = ctxt->input->id;
	    /* Recurse on second child */
	    NEXT;
	    SKIP_BLANKS_PE;
	    last = xmlParseElementChildrenContentDeclPriv(ctxt, inputid,
                                                          depth + 1);
            if (last == NULL) {
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
            }
	    SKIP_BLANKS_PE;
	} else {
	    elem = xmlParseName(ctxt);
	    if (elem == NULL) {
		xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED, NULL);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    last = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
	    if (last == NULL) {
                xmlErrMemory(ctxt);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    if (RAW == '?') {
		last->ocur = XML_ELEMENT_CONTENT_OPT;
		NEXT;
	    } else if (RAW == '*') {
		last->ocur = XML_ELEMENT_CONTENT_MULT;
		NEXT;
	    } else if (RAW == '+') {
		last->ocur = XML_ELEMENT_CONTENT_PLUS;
		NEXT;
	    } else {
		last->ocur = XML_ELEMENT_CONTENT_ONCE;
	    }
	}
	SKIP_BLANKS_PE;
	GROW;
    }
    if ((cur != NULL) && (last != NULL)) {
        cur->c2 = last;
	if (last != NULL)
	    last->parent = cur;
    }
    if (ctxt->input->id != inputchk) {
	xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                       "Element content declaration doesn't start and stop in"
                       " the same entity\n");
    }
    NEXT;
    if (RAW == '?') {
	if (ret != NULL) {
	    if ((ret->ocur == XML_ELEMENT_CONTENT_PLUS) ||
	        (ret->ocur == XML_ELEMENT_CONTENT_MULT))
	        ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    else
	        ret->ocur = XML_ELEMENT_CONTENT_OPT;
	}
	NEXT;
    } else if (RAW == '*') {
	if (ret != NULL) {
	    ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    cur = ret;
	    /*
	     * Some normalization:
	     * (a | b* | c?)* == (a | b | c)*
	     */
	    while ((cur != NULL) && (cur->type == XML_ELEMENT_CONTENT_OR)) {
		if ((cur->c1 != NULL) &&
	            ((cur->c1->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c1->ocur == XML_ELEMENT_CONTENT_MULT)))
		    cur->c1->ocur = XML_ELEMENT_CONTENT_ONCE;
		if ((cur->c2 != NULL) &&
	            ((cur->c2->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c2->ocur == XML_ELEMENT_CONTENT_MULT)))
		    cur->c2->ocur = XML_ELEMENT_CONTENT_ONCE;
		cur = cur->c2;
	    }
	}
	NEXT;
    } else if (RAW == '+') {
	if (ret != NULL) {
	    int found = 0;

	    if ((ret->ocur == XML_ELEMENT_CONTENT_OPT) ||
	        (ret->ocur == XML_ELEMENT_CONTENT_MULT))
	        ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    else
	        ret->ocur = XML_ELEMENT_CONTENT_PLUS;
	    /*
	     * Some normalization:
	     * (a | b*)+ == (a | b)*
	     * (a | b?)+ == (a | b)*
	     */
	    while ((cur != NULL) && (cur->type == XML_ELEMENT_CONTENT_OR)) {
		if ((cur->c1 != NULL) &&
	            ((cur->c1->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c1->ocur == XML_ELEMENT_CONTENT_MULT))) {
		    cur->c1->ocur = XML_ELEMENT_CONTENT_ONCE;
		    found = 1;
		}
		if ((cur->c2 != NULL) &&
	            ((cur->c2->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c2->ocur == XML_ELEMENT_CONTENT_MULT))) {
		    cur->c2->ocur = XML_ELEMENT_CONTENT_ONCE;
		    found = 1;
		}
		cur = cur->c2;
	    }
	    if (found)
		ret->ocur = XML_ELEMENT_CONTENT_MULT;
	}
	NEXT;
    }
    return(ret);
}